

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,REF_NODE ref_node)

{
  size_t __size;
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_CLOUD pRVar4;
  REF_DBL *pRVar5;
  REF_MPI pRVar6;
  uint uVar7;
  undefined4 *__ptr;
  ulong uVar8;
  undefined4 *__ptr_00;
  REF_INT *send_size;
  REF_INT *pRVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  char *pcVar16;
  REF_INT local;
  REF_MPI local_b0;
  REF_INT *local_a8;
  ulong local_a0;
  void *local_98;
  ulong local_90;
  REF_INT *local_88;
  void *local_80;
  void *local_78;
  REF_INT *local_70;
  REF_MPI local_68;
  void *local_60;
  REF_MPI local_58;
  void *local_50;
  void *local_48;
  REF_CLOUD *local_40;
  void *local_38;
  
  local_b0 = ref_node->ref_mpi;
  uVar15 = (ulong)local_b0->n;
  if ((long)uVar15 < 2) {
    return 0;
  }
  __size = uVar15 * 4;
  __ptr = (undefined4 *)malloc(__size);
  if (__ptr == (undefined4 *)0x0) {
    pcVar16 = "malloc a_next of REF_INT NULL";
    uVar14 = 0x321;
  }
  else {
    for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
      __ptr[uVar8] = 0;
    }
    __ptr_00 = (undefined4 *)malloc(__size);
    if (__ptr_00 == (undefined4 *)0x0) {
      pcVar16 = "malloc b_next of REF_INT NULL";
      uVar14 = 0x322;
    }
    else {
      for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
        __ptr_00[uVar8] = 0;
      }
      local_40 = one_layer;
      send_size = (REF_INT *)malloc(__size);
      if (send_size == (REF_INT *)0x0) {
        pcVar16 = "malloc a_nnode of REF_INT NULL";
        uVar14 = 0x323;
      }
      else {
        for (uVar8 = 0; uVar8 < uVar15; uVar8 = uVar8 + 1) {
          send_size[uVar8] = 0;
        }
        pRVar9 = (REF_INT *)malloc(__size);
        if (pRVar9 == (REF_INT *)0x0) {
          pcVar16 = "malloc b_nnode of REF_INT NULL";
          uVar14 = 0x324;
        }
        else {
          for (uVar8 = 0; uVar8 < uVar15; uVar8 = uVar8 + 1) {
            pRVar9[uVar8] = 0;
          }
          local_70 = pRVar9;
          pRVar9 = (REF_INT *)malloc(__size);
          if (pRVar9 == (REF_INT *)0x0) {
            pcVar16 = "malloc a_ncloud of REF_INT NULL";
            uVar14 = 0x325;
          }
          else {
            for (uVar8 = 0; uVar8 < uVar15; uVar8 = uVar8 + 1) {
              pRVar9[uVar8] = 0;
            }
            local_88 = pRVar9;
            pRVar9 = (REF_INT *)malloc(__size);
            pRVar6 = local_b0;
            if (pRVar9 == (REF_INT *)0x0) {
              pcVar16 = "malloc b_ncloud of REF_INT NULL";
              uVar14 = 0x326;
            }
            else {
              for (uVar8 = 0; uVar8 < uVar15; uVar8 = uVar8 + 1) {
                pRVar9[uVar8] = 0;
              }
              uVar8 = 0;
              uVar15 = (ulong)(uint)ref_node->max;
              if (ref_node->max < 1) {
                uVar15 = uVar8;
              }
              for (; uVar15 != uVar8; uVar8 = uVar8 + 1) {
                if ((-1 < ref_node->global[uVar8]) && (local_b0->id != ref_node->part[uVar8])) {
                  send_size[ref_node->part[uVar8]] = send_size[ref_node->part[uVar8]] + 1;
                }
              }
              local_a8 = pRVar9;
              uVar7 = ref_mpi_alltoall(local_b0,send_size,local_70,1);
              if (uVar7 != 0) {
                pcVar16 = "alltoall nnodes";
                uVar14 = 0x330;
                uVar15 = (ulong)uVar7;
LAB_001a684e:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,uVar14,"ref_recon_ghost_cloud",uVar15,pcVar16);
                return uVar7;
              }
              uVar7 = pRVar6->n;
              uVar15 = 0;
              uVar8 = 0;
              if (0 < (int)uVar7) {
                uVar8 = (ulong)uVar7;
              }
              pvVar10 = (void *)0x0;
              for (; uVar8 != uVar15; uVar15 = uVar15 + 1) {
                pvVar10 = (void *)(ulong)(uint)((int)pvVar10 + send_size[uVar15]);
              }
              if ((int)pvVar10 < 0) {
                pcVar16 = "malloc a_global of REF_GLOB negative";
                uVar14 = 0x334;
LAB_001a6958:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,uVar14,"ref_recon_ghost_cloud",pcVar16);
                return 1;
              }
              local_a0 = (long)(int)uVar7;
              local_98 = pvVar10;
              pvVar10 = malloc((long)pvVar10 * 8);
              if (pvVar10 == (void *)0x0) {
                pcVar16 = "malloc a_global of REF_GLOB NULL";
                uVar14 = 0x334;
              }
              else {
                local_38 = pvVar10;
                pvVar10 = malloc((long)local_98 << 2);
                if (pvVar10 == (void *)0x0) {
                  pcVar16 = "malloc a_part of REF_INT NULL";
                  uVar14 = 0x335;
                }
                else {
                  uVar7 = 0;
                  for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
                    uVar7 = uVar7 + local_70[uVar15];
                  }
                  if ((int)uVar7 < 0) {
                    pcVar16 = "malloc b_global of REF_GLOB negative";
                    uVar14 = 0x339;
                    goto LAB_001a6958;
                  }
                  uVar15 = (ulong)uVar7;
                  local_48 = pvVar10;
                  pvVar10 = malloc(uVar15 * 8);
                  if (pvVar10 == (void *)0x0) {
                    pcVar16 = "malloc b_global of REF_GLOB NULL";
                    uVar14 = 0x339;
                  }
                  else {
                    local_98 = malloc(uVar15 * 4);
                    pRVar9 = local_70;
                    if (local_98 != (void *)0x0) {
                      *__ptr = 0;
                      iVar12 = 0;
                      for (lVar11 = 1; lVar11 < (long)local_a0; lVar11 = lVar11 + 1) {
                        iVar12 = iVar12 + send_size[lVar11 + -1];
                        __ptr[lVar11] = iVar12;
                      }
                      uVar13 = 0;
                      uVar8 = (ulong)(uint)ref_node->max;
                      if (ref_node->max < 1) {
                        uVar8 = uVar13;
                      }
                      for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                        if (-1 < ref_node->global[uVar13]) {
                          iVar12 = local_b0->id;
                          pRVar3 = ref_node->part;
                          iVar1 = pRVar3[uVar13];
                          if (iVar12 != iVar1) {
                            iVar1 = __ptr[iVar1];
                            *(REF_GLOB *)((long)local_38 + (long)iVar1 * 8) =
                                 ref_node->global[uVar13];
                            *(int *)((long)local_48 + (long)iVar1 * 4) = iVar12;
                            __ptr[pRVar3[uVar13]] = __ptr[pRVar3[uVar13]] + 1;
                          }
                        }
                      }
                      local_a0 = uVar15;
                      uVar7 = ref_mpi_alltoallv(local_b0,local_38,send_size,pvVar10,local_70,1,2);
                      if (uVar7 == 0) {
                        local_78 = pvVar10;
                        uVar7 = ref_mpi_alltoallv(local_b0,local_48,send_size,local_98,pRVar9,1,1);
                        if (uVar7 == 0) {
                          for (uVar15 = 0; local_a0 != uVar15; uVar15 = uVar15 + 1) {
                            uVar7 = ref_node_local(ref_node,*(REF_GLOB *)
                                                             ((long)local_78 + uVar15 * 8),&local);
                            if (uVar7 != 0) {
                              uVar15 = (ulong)uVar7;
                              pcVar16 = "g2l";
                              uVar14 = 0x353;
                              goto LAB_001a6c50;
                            }
                            local_a8[*(int *)((long)local_98 + uVar15 * 4)] =
                                 local_a8[*(int *)((long)local_98 + uVar15 * 4)] +
                                 local_40[local]->n;
                          }
                          uVar7 = ref_mpi_alltoall(local_b0,local_a8,local_88,1);
                          if (uVar7 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                   ,0x35a,"ref_recon_ghost_cloud",(ulong)uVar7,"alltoall nclouds");
                            return uVar7;
                          }
                          uVar7 = local_b0->n;
                          local_58 = (REF_MPI)(long)(int)uVar7;
                          uVar15 = 0;
                          uVar8 = 0;
                          if (0 < (int)uVar7) {
                            uVar8 = (ulong)uVar7;
                          }
                          local_90 = 0;
                          for (; iVar12 = (int)local_90, uVar8 != uVar15; uVar15 = uVar15 + 1) {
                            local_90 = (ulong)(uint)(iVar12 + local_88[uVar15]);
                          }
                          if (iVar12 < 0) {
                            pcVar16 = "malloc a_keyval of REF_GLOB negative";
                            uVar14 = 0x35e;
                            goto LAB_001a6958;
                          }
                          local_80 = malloc((ulong)(uint)(iVar12 * 2) << 3);
                          if (local_80 == (void *)0x0) {
                            pcVar16 = "malloc a_keyval of REF_GLOB NULL";
                            uVar14 = 0x35e;
                            goto LAB_001a689b;
                          }
                          local_68 = (REF_MPI)malloc((ulong)(uint)((int)local_90 * 4) << 3);
                          if (local_68 == (REF_MPI)0x0) {
                            pcVar16 = "malloc a_aux of REF_DBL NULL";
                            uVar14 = 0x35f;
                            goto LAB_001a689b;
                          }
                          iVar12 = 0;
                          for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
                            iVar12 = iVar12 + local_a8[uVar15];
                          }
                          if (iVar12 < 0) {
                            pcVar16 = "malloc b_keyval of REF_GLOB negative";
                            uVar14 = 0x363;
                            goto LAB_001a6958;
                          }
                          local_60 = malloc((ulong)(uint)(iVar12 * 2) << 3);
                          if (local_60 == (void *)0x0) {
                            pcVar16 = "malloc b_keyval of REF_GLOB NULL";
                            uVar14 = 0x363;
                            goto LAB_001a689b;
                          }
                          local_50 = malloc((ulong)(uint)(iVar12 << 2) << 3);
                          if (local_50 == (void *)0x0) {
                            pcVar16 = "malloc b_aux of REF_DBL NULL";
                            uVar14 = 0x364;
                            local_50 = (void *)0x0;
                            goto LAB_001a689b;
                          }
                          *__ptr_00 = 0;
                          iVar12 = 0;
                          for (lVar11 = 1; lVar11 < (long)local_58; lVar11 = lVar11 + 1) {
                            iVar12 = iVar12 + local_a8[lVar11 + -1];
                            __ptr_00[lVar11] = iVar12;
                          }
                          for (uVar15 = 0; uVar15 != local_a0; uVar15 = uVar15 + 1) {
                            uVar7 = ref_node_local(ref_node,*(REF_GLOB *)
                                                             ((long)local_78 + uVar15 * 8),&local);
                            if (uVar7 != 0) {
                              uVar15 = (ulong)uVar7;
                              pcVar16 = "g2l";
                              uVar14 = 0x36c;
                              goto LAB_001a6c50;
                            }
                            iVar12 = *(int *)((long)local_98 + uVar15 * 4);
                            pRVar4 = local_40[local];
                            uVar8 = (ulong)(uint)pRVar4->n;
                            if (pRVar4->n < 1) {
                              uVar8 = 0;
                            }
                            for (uVar13 = 0; uVar13 != uVar8; uVar13 = uVar13 + 1) {
                              iVar1 = __ptr_00[iVar12];
                              *(undefined8 *)((long)local_60 + (long)iVar1 * 0x10) =
                                   *(undefined8 *)((long)local_78 + uVar15 * 8);
                              *(REF_GLOB *)((long)local_60 + (long)(iVar1 * 2 + 1) * 8) =
                                   pRVar4->global[uVar13];
                              iVar2 = pRVar4->naux;
                              pRVar5 = pRVar4->aux;
                              for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
                                *(REF_DBL *)((long)local_50 + lVar11 * 8 + (long)(iVar1 * 4) * 8) =
                                     pRVar5[iVar2 * (int)uVar13 + lVar11];
                              }
                              __ptr_00[iVar12] = iVar1 + 1;
                            }
                          }
                          uVar7 = ref_mpi_alltoallv(local_b0,local_60,local_a8,local_80,local_88,2,2
                                                   );
                          if (uVar7 == 0) {
                            uVar7 = ref_mpi_alltoallv(local_b0,local_50,local_a8,local_68,local_88,4
                                                      ,3);
                            if (uVar7 == 0) {
                              local_90 = (local_90 & 0xffffffff) * 0x10 + 0x10;
                              local_b0 = local_68;
                              uVar8 = 0;
                              do {
                                local_a0 = uVar8 + 0x10;
                                if (local_90 == local_a0) {
                                  free(local_50);
                                  free(local_60);
                                  free(local_68);
                                  free(local_80);
                                  free(local_98);
                                  free(local_78);
                                  free(local_48);
                                  free(local_38);
                                  free(local_a8);
                                  free(local_88);
                                  free(local_70);
                                  free(send_size);
                                  free(__ptr_00);
                                  free(__ptr);
                                  return 0;
                                }
                                uVar7 = ref_node_local(ref_node,*(REF_GLOB *)
                                                                 ((long)local_80 + uVar8),&local);
                                if (uVar7 != 0) {
                                  uVar15 = (ulong)uVar7;
                                  pcVar16 = "g2l";
                                  uVar14 = 900;
                                  goto LAB_001a6c50;
                                }
                                local_58 = (REF_MPI)&local_b0->first_time;
                                uVar7 = ref_cloud_store(local_40[local],
                                                        *(REF_GLOB *)((long)local_80 + uVar8 + 8),
                                                        (REF_DBL *)local_b0);
                                uVar15 = (ulong)uVar7;
                                local_b0 = local_58;
                                uVar8 = local_a0;
                              } while (uVar7 == 0);
                              pcVar16 = "add ghost";
                              uVar14 = 0x388;
                            }
                            else {
                              uVar15 = (ulong)uVar7;
                              pcVar16 = "alltoallv aux";
                              uVar14 = 0x380;
                            }
                          }
                          else {
                            uVar15 = (ulong)uVar7;
                            pcVar16 = "alltoallv keyval";
                            uVar14 = 0x37d;
                          }
                        }
                        else {
                          uVar15 = (ulong)uVar7;
                          pcVar16 = "alltoallv part";
                          uVar14 = 0x34f;
                        }
                      }
                      else {
                        uVar15 = (ulong)uVar7;
                        pcVar16 = "alltoallv global";
                        uVar14 = 0x34c;
                      }
LAB_001a6c50:
                      uVar7 = (uint)uVar15;
                      goto LAB_001a684e;
                    }
                    pcVar16 = "malloc b_part of REF_INT NULL";
                    uVar14 = 0x33a;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001a689b:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar14,
         "ref_recon_ghost_cloud",pcVar16);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_recon_ghost_cloud(REF_CLOUD *one_layer,
                                         REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_CLOUD ref_cloud;
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ncloud, *b_ncloud;
  REF_INT a_ncloud_total, b_ncloud_total;
  REF_GLOB *a_keyval, *b_keyval;
  REF_DBL *a_aux, *b_aux;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, cloud, key_index, aux_index;
  REF_GLOB global;
  REF_INT nkeyval = 2, naux = 4;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ncloud, ref_mpi_n(ref_mpi), REF_INT, 0);

  /* ghost nodes need to fill */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv part");

  /* degree of these node cloud to send */
  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    degree = ref_cloud_n(one_layer[local]);
    b_ncloud[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ncloud, a_ncloud, REF_INT_TYPE),
      "alltoall nclouds");

  a_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ncloud_total += a_ncloud[part];
  ref_malloc(a_keyval, nkeyval * a_ncloud_total, REF_GLOB);
  ref_malloc(a_aux, naux * a_ncloud_total, REF_DBL);

  b_ncloud_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ncloud_total += b_ncloud[part];
  ref_malloc(b_keyval, nkeyval * b_ncloud_total, REF_GLOB);
  ref_malloc(b_aux, naux * b_ncloud_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ncloud[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    ref_cloud = one_layer[local];
    each_ref_cloud_item(ref_cloud, key_index) {
      b_keyval[0 + nkeyval * b_next[part]] = b_global[node];
      b_keyval[1 + nkeyval * b_next[part]] =
          ref_cloud_global(ref_cloud, key_index);
      for (aux_index = 0; aux_index < naux; aux_index++) {
        b_aux[aux_index + naux * b_next[part]] =
            ref_cloud_aux(ref_cloud, aux_index, key_index);
      }
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_keyval, b_ncloud, a_keyval, a_ncloud,
                        nkeyval, REF_GLOB_TYPE),
      "alltoallv keyval");
  RSS(ref_mpi_alltoallv(ref_mpi, b_aux, b_ncloud, a_aux, a_ncloud, naux,
                        REF_DBL_TYPE),
      "alltoallv aux");

  for (cloud = 0; cloud < a_ncloud_total; cloud++) {
    global = a_keyval[0 + nkeyval * cloud];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    ref_cloud = one_layer[local];
    RSS(ref_cloud_store(ref_cloud, a_keyval[1 + nkeyval * cloud],
                        &(a_aux[naux * cloud])),
        "add ghost");
  }

  free(b_aux);
  free(b_keyval);
  free(a_aux);
  free(a_keyval);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ncloud);
  free(a_ncloud);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}